

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O2

void pnga_matmul_basic(char *transa,char *transb,void *alpha,void *beta,Integer g_a,Integer *alo,
                      Integer *ahi,Integer g_b,Integer *blo,Integer *bhi,Integer g_c,Integer *clo,
                      Integer *chi)

{
  Integer IVar1;
  int iVar2;
  logical lVar3;
  void *__ptr;
  void *__ptr_00;
  ulong uVar4;
  long lVar5;
  long lVar6;
  char *pcVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  size_t __size;
  ulong uVar11;
  bool bVar12;
  long cdim_t;
  long bdim_t;
  long adim_t;
  long kdim_t;
  long jdim_t;
  long idim_t;
  Integer crank;
  Integer atype;
  Integer local_688;
  Integer ld;
  Integer brank;
  int local_66c;
  undefined8 local_668;
  Integer arank;
  long local_658;
  char *src_ptr;
  Integer ctype;
  Integer btype;
  undefined8 local_638;
  undefined8 uStack_630;
  Integer hit [7];
  Integer lot [7];
  long local_5a8;
  Integer local_5a0;
  Integer loB [7];
  Integer local_528;
  long local_520;
  Integer loA [7];
  Integer loC [7];
  Integer lC [7];
  Integer hiC [7];
  Integer cdims [7];
  Integer bdims [7];
  Integer adims [7];
  _iterator_hdl hdl_c;
  
  local_638 = 0x3ff0000000000000;
  uStack_630 = 0;
  local_668 = 0x3f800000;
  bVar12 = _ga_sync_begin != 0;
  local_66c = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = _ga_sync_begin;
  local_688 = g_a;
  if (bVar12) {
    pnga_sync();
  }
  if (((byte)(*transa | 0x20U) == 0x74) || ((byte)(*transb | 0x20U) == 0x74)) {
    pnga_error("Cannot do basic multiply with tranpose ",0);
  }
  lVar3 = pnga_is_mirrored(local_688);
  if (((lVar3 != 0) || (lVar3 = pnga_is_mirrored(g_b), lVar3 != 0)) ||
     (lVar3 = pnga_is_mirrored(g_c), lVar3 != 0)) {
    pnga_error("Cannot do basic multiply with mirrored arrays ",0);
  }
  pnga_inquire(local_688,&atype,&arank,adims);
  pnga_inquire(g_b,&btype,&brank,bdims);
  pnga_inquire(g_c,&ctype,&crank,cdims);
  if (arank != 2) {
    pnga_error("rank of A must be 2 ",arank);
  }
  if (brank != 2) {
    pnga_error("rank of B must be 2 ",brank);
  }
  if (crank != 2) {
    pnga_error("rank of C must be 2 ",crank);
  }
  if ((atype != btype) || (atype != ctype)) {
    pnga_error(" types mismatch ",0);
  }
  if ((4 < atype - 0x3ebU) || ((0x1bU >> ((uint)(atype - 0x3ebU) & 0x1f) & 1) == 0)) {
    pnga_error(" type error: type not supported ",atype);
  }
  for (lVar8 = 0; lVar8 < arank; lVar8 = lVar8 + 1) {
    if (((alo[lVar8] < 1) || (adims[lVar8] < alo[lVar8])) ||
       (ahi[lVar8] < 1 || adims[lVar8] < ahi[lVar8])) {
      pnga_error("Patch is out of bounds for A ",0);
    }
  }
  for (lVar8 = 0; lVar8 < brank; lVar8 = lVar8 + 1) {
    if (((blo[lVar8] < 1) || (bdims[lVar8] < blo[lVar8])) ||
       (bhi[lVar8] < 1 || bdims[lVar8] < bhi[lVar8])) {
      pnga_error("Patch is out of bounds for B ",0);
    }
  }
  for (lVar8 = 0; lVar8 < crank; lVar8 = lVar8 + 1) {
    if (((clo[lVar8] < 1) || (cdims[lVar8] < clo[lVar8])) ||
       (chi[lVar8] < 1 || cdims[lVar8] < chi[lVar8])) {
      pnga_error("Patch is out of bounds for C ",0);
    }
  }
  for (lVar8 = 0; lVar8 < arank; lVar8 = lVar8 + 1) {
    if (ahi[lVar8] < alo[lVar8]) {
      pnga_error("No data in patch on A ",0);
    }
  }
  for (lVar8 = 0; lVar8 < brank; lVar8 = lVar8 + 1) {
    if (bhi[lVar8] < blo[lVar8]) {
      pnga_error("No data in patch on B ",0);
    }
  }
  for (lVar8 = 0; lVar8 < crank; lVar8 = lVar8 + 1) {
    if (chi[lVar8] < clo[lVar8]) {
      pnga_error("No data in patch on C ",0);
    }
  }
  lVar8 = *ahi;
  lVar5 = *alo;
  lVar6 = bhi[1];
  lVar9 = blo[1];
  if (ahi[1] - alo[1] != *bhi - *blo) {
    pnga_error("Inner dimensions of A and B do not match ",0);
  }
  if ((lVar8 - lVar5 != *chi - *clo) || (lVar6 - lVar9 != chi[1] - clo[1])) {
    pnga_error("Outer dimensions of A and B do not match dimensions of C ",0);
  }
  pnga_scale_patch(g_c,clo,chi,beta);
  pnga_local_iterator_init(g_c,&hdl_c);
  do {
    do {
      iVar2 = pnga_local_iterator_next(&hdl_c,loC,hiC,&src_ptr,lC);
      if (iVar2 == 0) {
        if (local_66c != 0) {
          pnga_sync();
        }
        return;
      }
      lVar8 = 0;
      if (0 < crank) {
        lVar8 = crank;
      }
      for (lVar5 = 0; lVar8 != lVar5; lVar5 = lVar5 + 1) {
        lot[lVar5] = loC[lVar5];
        hit[lVar5] = hiC[lVar5];
      }
      lVar3 = pnga_patch_intersect(loC,hiC,lot,hit,crank);
      IVar1 = lot[0];
    } while (lVar3 == 0);
    lVar6 = ahi[1] - alo[1];
    lVar9 = (hit[0] - lot[0]) + 1;
    lVar5 = (lVar6 + 1) / lVar9;
    lVar8 = lVar9 * lVar5;
    pcVar7 = src_ptr + ((lot[0] - loC[0]) + (lot[1] - loC[1]) * lC[0]) *
                       *(long *)(&fde_001cf308 + atype * 4);
    lVar5 = (ulong)(lVar8 - lVar6 == 0 || lVar8 < lVar6) + lVar5;
    uVar11 = ((hit[1] - lot[1]) + 1) * lVar9;
    __size = *(long *)(&fde_001cf308 + atype * 4) * uVar11;
    __ptr = malloc(__size);
    __ptr_00 = malloc(__size);
    lVar8 = 0;
    if (0 < lVar5) {
      lVar8 = lVar5;
    }
    lVar6 = (IVar1 - *clo) / lVar9 << 0x20;
    local_658 = lVar5;
    while (bVar12 = lVar8 != 0, lVar8 = lVar8 + -1, bVar12) {
      lVar5 = (lVar6 >> 0x20) % local_658;
      ld = (hit[0] - lot[0]) + 1;
      loA[1] = ld * lVar5 + alo[1];
      loA[0] = lot[0];
      local_528 = hit[0];
      local_520 = (hit[0] - lot[0]) + loA[1];
      if (ahi[1] <= local_520) {
        local_520 = ahi[1];
      }
      uVar10 = ((local_520 - loA[1]) + 1) * ld;
      if (uVar10 - uVar11 != 0 && (long)uVar11 <= (long)uVar10) {
        uVar4 = pnga_nodeid();
        printf("p[%d] size_a: %d size_c: %d\n",uVar4 & 0xffffffff,uVar10 & 0xffffffff,
               uVar11 & 0xffffffff);
      }
      pnga_get(local_688,loA,&local_528,__ptr,&ld);
      loB[1] = lot[1];
      local_5a0 = hit[1];
      loB[0] = ((hit[0] - lot[0]) + 1) * lVar5 + *blo;
      local_5a8 = (hit[0] - lot[0]) + loB[0];
      if (*bhi <= local_5a8) {
        local_5a8 = *bhi;
      }
      ld = (local_5a8 - loB[0]) + 1;
      uVar10 = ((hit[1] - lot[1]) + 1) * ld;
      if (uVar10 - uVar11 != 0 && (long)uVar11 <= (long)uVar10) {
        uVar4 = pnga_nodeid();
        printf("p[%d] size_b: %d size_c: %d\n",uVar4 & 0xffffffff,uVar10 & 0xffffffff,
               uVar11 & 0xffffffff);
      }
      pnga_get(g_b,loB,&local_5a8,__ptr_00,&ld);
      adim_t = (local_528 - loA[0]) + 1;
      kdim_t = (local_520 - loA[1]) + 1;
      jdim_t = (local_5a0 - loB[1]) + 1;
      bdim_t = (local_5a8 - loB[0]) + 1;
      cdim_t = lC[0];
      idim_t = adim_t;
      switch(atype) {
      case 0x3eb:
        gal_sgemm_(transa,transb,&idim_t,&jdim_t,&kdim_t,alpha,__ptr,&adim_t,__ptr_00,&bdim_t,
                   &local_668,pcVar7,&cdim_t,1,1);
        break;
      case 0x3ec:
        gal_dgemm_(transa,transb,&idim_t,&jdim_t,&kdim_t,alpha,__ptr,&adim_t,__ptr_00,&bdim_t,
                   &local_638,pcVar7,&cdim_t,1,1);
        break;
      default:
        pnga_error("ga_matmul_basic: wrong data type",atype);
        break;
      case 0x3ee:
        gal_cgemm_(transa,transb,&idim_t,&jdim_t,&kdim_t,alpha,__ptr,&adim_t,__ptr_00,&bdim_t,
                   &local_668,pcVar7,&cdim_t,1,1);
        break;
      case 0x3ef:
        gal_zgemm_(transa,transb,&idim_t,&jdim_t,&kdim_t,alpha,__ptr,&adim_t,__ptr_00,&bdim_t,
                   &local_638,pcVar7,&cdim_t,1,1);
      }
      lVar6 = lVar6 + 0x100000000;
    }
    free(__ptr);
    free(__ptr_00);
  } while( true );
}

Assistant:

void pnga_matmul_basic(char *transa, char *transb, void *alpha, void *beta,
		                 Integer g_a, Integer alo[], Integer ahi[], 
                       Integer g_b, Integer blo[], Integer bhi[], 
		                 Integer g_c, Integer clo[], Integer chi[])
{
  Integer atype, btype, ctype;
  Integer adims[GA_MAX_DIM],bdims[GA_MAX_DIM],cdims[GA_MAX_DIM],tmpld[GA_MAX_DIM];
  Integer n, m, k, nb, adim, bdim, cdim, arank, brank, crank;
  Integer loC[MAXDIM], hiC[MAXDIM], lot[MAXDIM], hit[MAXDIM], lC[MAXDIM];
  Integer nlo, loA[MAXDIM], hiA[MAXDIM], loB[MAXDIM], hiB[MAXDIM];
  DoubleComplex ONE_Z;
  SingleComplex ONE_F;
  BlasInt idim_t, jdim_t, kdim_t, adim_t, bdim_t, cdim_t;
  char *src_ptr;
  _iterator_hdl hdl_c;
  int local_sync_begin,local_sync_end;

  ONE_Z.real = 1.0;
  ONE_Z.imag = 0.0;
  ONE_F.real = 1.0;
  ONE_F.imag = 0.0;

  local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
  _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
  if(local_sync_begin)pnga_sync();

  /* For the time being, punt on transposes*/
  if (*transa == 't' || *transa == 'T' || *transb == 't' || *transb == 'T') {
    pnga_error("Cannot do basic multiply with tranpose ",0);
  }
  /* For the time being, punt on mirrored arrays */
  if (pnga_is_mirrored(g_a) || pnga_is_mirrored(g_b) || pnga_is_mirrored(g_c)) {
    pnga_error("Cannot do basic multiply with mirrored arrays ",0);
  }


  pnga_inquire(g_a, &atype, &arank, adims);
  pnga_inquire(g_b, &btype, &brank, bdims);
  pnga_inquire(g_c, &ctype, &crank, cdims);

  /* Can't handle dimensions other than 2 */
  if(arank != 2)  pnga_error("rank of A must be 2 ",arank);
  if(brank != 2)  pnga_error("rank of B must be 2 ",brank);
  if(crank != 2)  pnga_error("rank of C must be 2 ",crank);

  if(atype != btype || atype != ctype ) pnga_error(" types mismatch ", 0L);
  if(atype != C_DCPL && atype != C_DBL && atype != C_FLOAT && atype != C_SCPL)
    pnga_error(" type error: type not supported ",atype);

  /* Check that patch dims are reasonable */
  for (n=0; n<arank; n++) {
    if (alo[n] <= 0 || alo[n] > adims[n] || ahi[n] <= 0 || ahi[n] > adims[n]) {
      pnga_error("Patch is out of bounds for A ",0);
    }
  }
  for (n=0; n<brank; n++) {
    if (blo[n] <= 0 || blo[n] > bdims[n] || bhi[n] <= 0 || bhi[n] > bdims[n]) {
      pnga_error("Patch is out of bounds for B ",0);
    }
  }
  for (n=0; n<crank; n++) {
    if (clo[n] <= 0 || clo[n] > cdims[n] || chi[n] <= 0 || chi[n] > cdims[n]) {
      pnga_error("Patch is out of bounds for C ",0);
    }
  }

  /* Check that multiplication is feasible */
  for (n=0; n<arank; n++) {
    if (ahi[n]<alo[n]) pnga_error("No data in patch on A ",0);
  }

  for (n=0; n<brank; n++) {
    if (bhi[n]<blo[n]) pnga_error("No data in patch on B ",0);
  }
  for (n=0; n<crank; n++) {
    if (chi[n]<clo[n]) pnga_error("No data in patch on C ",0);
  }
  m = ahi[0]-alo[0]+1;
  k = ahi[1]-alo[1]+1;
  n = bhi[1]-blo[1]+1;
  if (k != bhi[0]-blo[0]+1) {
    pnga_error("Inner dimensions of A and B do not match ",0);
  }
  if (m != chi[0]-clo[0]+1 || n != chi[1]-clo[1]+1) {
    pnga_error("Outer dimensions of A and B do not match dimensions of C ",0);
  }

  /* Scale patch of C by beta */
  pnga_scale_patch(g_c,clo,chi,beta);

  /* Multiplication is feasible. Start iterating over patches of C */
  pnga_local_iterator_init(g_c, &hdl_c);
  while (pnga_local_iterator_next(&hdl_c, loC, hiC, &src_ptr, lC)) {
    Integer num_blocks;
    Integer offset, elemsize, ld;
    void *a_buf, *b_buf, *c_buf;
    Integer size_a, size_b, size_c;
    /*
    printf("p[%d] loC[0]: %d hiC[0]: %d loC[1]: %d hiC[1]: %d lC[0]: %d\n",
        pnga_nodeid(),loC[0],hiC[0],loC[1],hiC[1],lC[0]);
        */
    /* Copy limits since patch intersect modifies loC array */
    for (n=0; n<crank; n++) {
      lot[n] = loC[n];
      hit[n] = hiC[n];
    }

    /* check to see if this block overlaps with patch on C */
    if (pnga_patch_intersect(loC,hiC,lot,hit,crank)) {
      int istart, in;

      /* Calculating number of blocks for inner dimension. Assume that 
       * number of rows in block returned by iterator is a good size */
      num_blocks = (ahi[1]-alo[1]+1)/(hit[0]-lot[0]+1);
      if (num_blocks*(hit[0]-lot[0]+1) < ahi[1]-alo[1]+1) num_blocks++;

      /* Calculate offset from  src_ptr to beginning of lot */ 
      offset = lC[0]*(lot[1]-loC[1])+lot[0]-loC[0];
      elemsize = GAsizeofM(atype);
      c_buf = (void*)((char*)src_ptr + elemsize*offset);
      a_buf = (void*)malloc((hit[0]-lot[0]+1)*(hit[1]-lot[1]+1)*elemsize);
      b_buf = (void*)malloc((hit[0]-lot[0]+1)*(hit[1]-lot[1]+1)*elemsize);
      size_c = (hit[0]-lot[0]+1)*(hit[1]-lot[1]+1);

      /* calculate starting block index */
      istart = (lot[0]-clo[0])/(hit[0]-lot[0]+1);

      /* loop over block pairs */
      for (nb=0; nb<num_blocks; nb++) {
        /*
    printf("p[%d] loC[0]: %d hiC[0]: %d loC[1]: %d hiC[1]: %d\n",pnga_nodeid(),
        lot[0],hit[0],lot[1],hit[1]);
        */
        in = istart + nb;
        in = in%num_blocks;
        nlo = alo[1]+in*(hit[0]-lot[0]+1);
        loA[0] = lot[0];
        hiA[0] = hit[0];
        loA[1] = nlo;
        hiA[1] = loA[1]+(hit[0]-lot[0]);
        if (hiA[1] > ahi[1]) hiA[1] = ahi[1];
        ld = hiA[0]-loA[0]+1;
        size_a = (hiA[0]-loA[0]+1)*(hiA[1]-loA[1]+1);
        if (size_a > size_c) {
          printf("p[%d] size_a: %d size_c: %d\n",(int)pnga_nodeid(),(int)size_a,(int)size_c);
        }
        /*
    printf("p[%d] loA[0]: %d hiA[0]: %d loA[1]: %d hiA[1]: %d\n",pnga_nodeid(),
        loA[0],hiA[0],loA[1],hiA[1]);
        */
        pnga_get(g_a,loA,hiA,a_buf,&ld);
        /*
        printBlock("Matrix A",atype,a_buf,loA,hiA,&ld);
        */
        loB[1] = lot[1];
        hiB[1] = hit[1];
        nlo = blo[0]+in*(hit[0]-lot[0]+1);
        loB[0] = nlo;
        hiB[0] = loB[0]+(hit[0]-lot[0]);
        if (hiB[0] > bhi[0]) hiB[0] = bhi[0];
        ld = hiB[0]-loB[0]+1;
        size_b = (hiB[0]-loB[0]+1)*(hiB[1]-loB[1]+1);
        if (size_b > size_c) {
          printf("p[%d] size_b: %d size_c: %d\n",(int)pnga_nodeid(),
              (int)size_b,(int)size_c);
        }
        /*
    printf("p[%d] loB[0]: %d hiB[0]: %d loB[1]: %d hiB[1]: %d\n",pnga_nodeid(),
        loB[0],hiB[0],loB[1],hiB[1]);
        */
        pnga_get(g_b,loB,hiB,b_buf,&ld);
        /*
        printBlock("Matrix B",btype,b_buf,loB,hiB,&ld);
        */

        idim_t=(BlasInt)(hiA[0]-loA[0]+1);
        kdim_t=(BlasInt)(hiA[1]-loA[1]+1);
        jdim_t=(BlasInt)(hiB[1]-loB[1]+1);
        adim_t=hiA[0]-loA[0]+1;
        bdim_t=hiB[0]-loB[0]+1;
        cdim_t=lC[0];

        /*
        printf("p[%d] idim: %d jdim: %d kdim: %d adim: %d bdim: %d cdim: %d\n",
            pnga_nodeid(),idim_t,jdim_t,kdim_t,adim_t,bdim_t,cdim_t);
            */
        switch(atype) {
          case C_FLOAT:
            BLAS_SGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
                (Real *)alpha, (Real *)a_buf, &adim_t,
                (Real *)b_buf, &bdim_t, (Real *)&ONE_F,
                (Real *)c_buf, &cdim_t);
            break;
          case C_DBL:
            BLAS_DGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
                (DoublePrecision *)alpha, (DoublePrecision *)a_buf, &adim_t,
                (DoublePrecision *)b_buf, &bdim_t, (DoublePrecision *)&ONE_Z,
                (DoublePrecision *)c_buf, &cdim_t);
            break;
          case C_DCPL:
            BLAS_ZGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
                (DoubleComplex *)alpha, (DoubleComplex *)a_buf, &adim_t,
                (DoubleComplex *)b_buf, &bdim_t, (DoubleComplex *)&ONE_Z,
                (DoubleComplex *)c_buf, &cdim_t);
            break;
          case C_SCPL:
            BLAS_CGEMM(transa, transb, &idim_t, &jdim_t, &kdim_t,
                (SingleComplex *)alpha, (SingleComplex *)a_buf, &adim_t,
                (SingleComplex *)b_buf, &bdim_t, (SingleComplex *)&ONE_F,
                (SingleComplex *)c_buf, &cdim_t);
            break;
		  default:
		    pnga_error("ga_matmul_basic: wrong data type", atype);
		  }
      }

      /* multiplication is done, free buffers */
      free(a_buf);
      free(b_buf);
    }
  }
  if(local_sync_end)pnga_sync(); 
}